

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupTimes(Gia_Man_t *p,int nTimes)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  undefined8 uVar4;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Vec_Int_t *__ptr;
  int *piVar7;
  Vec_Int_t *__ptr_00;
  Vec_Int_t *__ptr_01;
  Vec_Int_t *__ptr_02;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  Vec_Int_t *p_01;
  long lVar14;
  int iVar15;
  int iVar16;
  
  if (nTimes < 1) {
    __assert_fail("nTimes > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x569,"Gia_Man_t *Gia_ManDupTimes(Gia_Man_t *, int)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pName = pcVar6;
  pcVar1 = p->pSpec;
  piVar7 = (int *)0x0;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pSpec = pcVar6;
  p->pObjs->Value = 0;
  iVar16 = p->nRegs;
  iVar15 = (p->vCis->nSize - iVar16) * nTimes;
  __ptr = (Vec_Int_t *)malloc(0x10);
  if (iVar15 - 1U < 0xf) {
    iVar15 = 0x10;
  }
  __ptr->nSize = 0;
  __ptr->nCap = iVar15;
  if (iVar15 != 0) {
    piVar7 = (int *)malloc((long)iVar15 << 2);
  }
  __ptr->pArray = piVar7;
  iVar15 = (p->vCos->nSize - iVar16) * nTimes;
  __ptr_00 = (Vec_Int_t *)malloc(0x10);
  if (iVar15 - 1U < 0xf) {
    iVar15 = 0x10;
  }
  __ptr_00->nSize = 0;
  __ptr_00->nCap = iVar15;
  if (iVar15 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar15 << 2);
  }
  __ptr_00->pArray = piVar7;
  __ptr_01 = (Vec_Int_t *)malloc(0x10);
  iVar15 = 0x10;
  if (0xe < iVar16 * nTimes - 1U) {
    iVar15 = iVar16 * nTimes;
  }
  __ptr_01->nSize = 0;
  __ptr_01->nCap = iVar15;
  if (iVar15 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar15 * 4);
  }
  __ptr_01->pArray = piVar7;
  __ptr_02 = (Vec_Int_t *)malloc(0x10);
  iVar16 = 0;
  __ptr_02->nSize = 0;
  __ptr_02->nCap = iVar15;
  if (iVar15 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar15 << 2);
  }
  __ptr_02->pArray = piVar7;
  uVar9 = (ulong)(uint)p->nObjs;
  do {
    if (1 < (int)uVar9) {
      lVar12 = 1;
      lVar14 = 0x14;
      do {
        pGVar2 = p->pObjs;
        uVar9 = *(ulong *)((long)pGVar2 + lVar14 + -8);
        uVar13 = (uint)uVar9;
        iVar15 = (int)(uVar9 & 0x1fffffff);
        if ((uVar9 & 0x1fffffff) == 0x1fffffff || (int)uVar13 < 0) {
          if ((uVar13 & 0x9fffffff) == 0x9fffffff) {
            pGVar8 = Gia_ManAppendObj(p_00);
            uVar9 = *(ulong *)pGVar8;
            *(ulong *)pGVar8 = uVar9 | 0x9fffffff;
            *(ulong *)pGVar8 =
                 uVar9 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar3 = p_00->pObjs;
            if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) {
LAB_001e0002:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
            pGVar3 = p_00->pObjs;
            if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_001e0002;
            iVar11 = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2);
            iVar15 = iVar11 * 0x55555556;
            *(int *)(&pGVar2->field_0x0 + lVar14) = iVar15;
            uVar4 = *(undefined8 *)((long)pGVar2 + lVar14 + -8);
            p_01 = __ptr_02;
            if ((((uint)uVar4 & 0x9fffffff) == 0x9fffffff) &&
               ((int)((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
              p_01 = __ptr;
            }
            if (iVar15 < 0) {
LAB_001e0021:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar13 = iVar11 * -0x55555555 & 0x7fffffff;
          }
          else {
            if (-1 < (int)uVar13 || iVar15 == 0x1fffffff) goto LAB_001dfd10;
            uVar10 = *(uint *)((long)pGVar2 + lVar14 + (ulong)(uint)(iVar15 << 2) * -3);
            if ((int)uVar10 < 0) goto LAB_001dffe3;
            uVar13 = Gia_ManAppendCo(p_00,uVar10 ^ uVar13 >> 0x1d & 1);
            *(uint *)(&pGVar2->field_0x0 + lVar14) = uVar13;
            uVar4 = *(undefined8 *)((long)pGVar2 + lVar14 + -8);
            uVar10 = (uint)uVar4;
            p_01 = __ptr_01;
            if (((~uVar10 & 0x1fffffff) != 0 && (int)uVar10 < 0) &&
               ((int)((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff) < p->vCos->nSize - p->nRegs)) {
              p_01 = __ptr_00;
            }
            if ((int)uVar13 < 0) goto LAB_001e0021;
            uVar13 = uVar13 >> 1;
          }
          Vec_IntPush(p_01,uVar13);
        }
        else {
          uVar13 = *(uint *)((long)pGVar2 + lVar14 + (ulong)(uint)(iVar15 << 2) * -3);
          if (((int)uVar13 < 0) ||
             (uVar10 = *(uint *)((long)pGVar2 +
                                lVar14 + (ulong)((uint)(uVar9 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar10 < 0)) {
LAB_001dffe3:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          iVar15 = Gia_ManAppendAnd(p_00,uVar13 ^ (uint)(uVar9 >> 0x1d) & 1,
                                    uVar10 ^ (uint)(uVar9 >> 0x3d) & 1);
          *(int *)(&pGVar2->field_0x0 + lVar14) = iVar15;
        }
LAB_001dfd10:
        lVar12 = lVar12 + 1;
        uVar9 = (ulong)p->nObjs;
        lVar14 = lVar14 + 0xc;
      } while (lVar12 < (long)uVar9);
    }
    iVar16 = iVar16 + 1;
  } while (iVar16 != nTimes);
  iVar16 = __ptr->nSize;
  p_00->vCis->nSize = 0;
  if (0 < (long)iVar16) {
    piVar7 = __ptr->pArray;
    lVar12 = 0;
    do {
      iVar15 = piVar7[lVar12];
      lVar14 = (long)iVar15;
      if ((lVar14 < 0) || (p_00->nObjs <= iVar15)) goto LAB_001e0040;
      uVar9 = *(ulong *)(p_00->pObjs + lVar14);
      if (-1 < (int)uVar9) goto LAB_001e005f;
      *(ulong *)(p_00->pObjs + lVar14) =
           uVar9 & 0xe0000000ffffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      Vec_IntPush(p_00->vCis,iVar15);
      lVar12 = lVar12 + 1;
    } while (iVar16 != lVar12);
  }
  iVar16 = __ptr_02->nSize;
  if (0 < (long)iVar16) {
    piVar7 = __ptr_02->pArray;
    lVar12 = 0;
    do {
      iVar15 = piVar7[lVar12];
      lVar14 = (long)iVar15;
      if ((lVar14 < 0) || (p_00->nObjs <= iVar15)) goto LAB_001e0040;
      uVar9 = *(ulong *)(p_00->pObjs + lVar14);
      if (-1 < (int)uVar9) goto LAB_001e005f;
      *(ulong *)(p_00->pObjs + lVar14) =
           uVar9 & 0xe0000000ffffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      Vec_IntPush(p_00->vCis,iVar15);
      lVar12 = lVar12 + 1;
    } while (iVar16 != lVar12);
  }
  p_00->vCos->nSize = 0;
  iVar16 = __ptr_00->nSize;
  if (0 < (long)iVar16) {
    piVar7 = __ptr_00->pArray;
    lVar12 = 0;
    do {
      iVar15 = piVar7[lVar12];
      lVar14 = (long)iVar15;
      if ((lVar14 < 0) || (p_00->nObjs <= iVar15)) goto LAB_001e0040;
      uVar9 = *(ulong *)(p_00->pObjs + lVar14);
      if (-1 < (int)uVar9) goto LAB_001e005f;
      *(ulong *)(p_00->pObjs + lVar14) =
           uVar9 & 0xe0000000ffffffff | (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      Vec_IntPush(p_00->vCos,iVar15);
      lVar12 = lVar12 + 1;
    } while (iVar16 != lVar12);
  }
  iVar16 = __ptr_01->nSize;
  if (0 < (long)iVar16) {
    piVar7 = __ptr_01->pArray;
    lVar12 = 0;
    do {
      iVar15 = piVar7[lVar12];
      lVar14 = (long)iVar15;
      if ((lVar14 < 0) || (p_00->nObjs <= iVar15)) {
LAB_001e0040:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar9 = *(ulong *)(p_00->pObjs + lVar14);
      if (-1 < (int)uVar9) {
LAB_001e005f:
        __assert_fail("pObj->fTerm",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1db,"void Gia_ObjSetCioId(Gia_Obj_t *, int)");
      }
      *(ulong *)(p_00->pObjs + lVar14) =
           uVar9 & 0xe0000000ffffffff | (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      Vec_IntPush(p_00->vCos,iVar15);
      lVar12 = lVar12 + 1;
    } while (iVar16 != lVar12);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  if (__ptr_01->pArray != (int *)0x0) {
    free(__ptr_01->pArray);
  }
  free(__ptr_01);
  if (__ptr_02->pArray != (int *)0x0) {
    free(__ptr_02->pArray);
  }
  free(__ptr_02);
  Gia_ManSetRegNum(p_00,nTimes * p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupTimes( Gia_Man_t * p, int nTimes )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vPis, * vPos, * vRis, * vRos;
    int i, t, Entry;
    assert( nTimes > 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    vPis = Vec_IntAlloc( Gia_ManPiNum(p) * nTimes );
    vPos = Vec_IntAlloc( Gia_ManPoNum(p) * nTimes );
    vRis = Vec_IntAlloc( Gia_ManRegNum(p) * nTimes );
    vRos = Vec_IntAlloc( Gia_ManRegNum(p) * nTimes );
    for ( t = 0; t < nTimes; t++ )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsAnd(pObj) )
                pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            else if ( Gia_ObjIsCi(pObj) )
            {
                pObj->Value = Gia_ManAppendCi( pNew );
                if ( Gia_ObjIsPi(p, pObj) )
                    Vec_IntPush( vPis, Abc_Lit2Var(pObj->Value) );
                else
                    Vec_IntPush( vRos, Abc_Lit2Var(pObj->Value) );
            }
            else if ( Gia_ObjIsCo(pObj) )
            {
                pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                if ( Gia_ObjIsPo(p, pObj) )
                    Vec_IntPush( vPos, Abc_Lit2Var(pObj->Value) );
                else
                    Vec_IntPush( vRis, Abc_Lit2Var(pObj->Value) );
            }
        }
    }
    Vec_IntClear( pNew->vCis );
    Vec_IntForEachEntry( vPis, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCis) );
        Vec_IntPush( pNew->vCis, Entry );
    }
    Vec_IntForEachEntry( vRos, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCis) );
        Vec_IntPush( pNew->vCis, Entry );
    }
    Vec_IntClear( pNew->vCos );
    Vec_IntForEachEntry( vPos, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCos) );
        Vec_IntPush( pNew->vCos, Entry );
    }
    Vec_IntForEachEntry( vRis, Entry, i )
    {
        Gia_ObjSetCioId( Gia_ManObj(pNew, Entry), Vec_IntSize(pNew->vCos) );
        Vec_IntPush( pNew->vCos, Entry );
    }
    Vec_IntFree( vPis );
    Vec_IntFree( vPos );
    Vec_IntFree( vRis );
    Vec_IntFree( vRos );
    Gia_ManSetRegNum( pNew, nTimes * Gia_ManRegNum(p) );
    return pNew;
}